

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O3

mat4_t * mat4_ortho2(mat4_t *__return_storage_ptr__,vec2_t lb,vec2_t rt)

{
  undefined8 in_XMM0_Qb;
  float fVar3;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar4;
  float fVar5;
  
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[3] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[1] = 0.0;
  fVar4 = rt.x - lb.x;
  fVar5 = rt.y - lb.y;
  fVar3 = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar1._0_8_ = CONCAT44(lb.y + rt.y,lb.x + rt.x) ^ 0x8000000080000000;
  auVar1._8_4_ = -((float)in_XMM0_Qb + in_XMM1_Dc);
  auVar1._12_4_ = -(fVar3 + in_XMM1_Dd);
  auVar2._4_4_ = fVar5;
  auVar2._0_4_ = fVar4;
  auVar2._8_4_ = in_XMM1_Dc - (float)in_XMM0_Qb;
  auVar2._12_4_ = in_XMM1_Dd - fVar3;
  auVar2 = divps(auVar1,auVar2);
  __return_storage_ptr__->m[2][2] = -1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = auVar2._0_4_;
  __return_storage_ptr__->m[3][1] = auVar2._4_4_;
  __return_storage_ptr__->m[0][0] = 2.0 / fVar4;
  __return_storage_ptr__->m[1][1] = 2.0 / fVar5;
  ((float *)((long)__return_storage_ptr__ + 0x30))[2] = -0.0;
  ((float *)((long)__return_storage_ptr__ + 0x30))[3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho2(vec2_t lb, vec2_t rt) {
    vec3_t	vl	= vec3(lb.x, lb.y, -1.0f);
    vec3_t	vr	= vec3(rt.x, rt.y,  1.0f);
    return mat4_ortho3(vl, vr);
}